

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O1

TValue * cpwriter(lua_State *L,lua_CFunction dummy,void *ud)

{
  uint v;
  undefined4 uVar1;
  ulong in_RAX;
  ulong uVar2;
  char *pcVar3;
  uint8_t zero;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if ((uint)(*(int *)((long)ud + 4) - *(int *)((long)ud + 8)) < 0x400) {
    lj_buf_need2((SBuf *)ud,0x400);
  }
  uVar2 = (ulong)*(uint *)(*(long *)((long)ud + 0x10) + 0x28);
  v = *(uint *)(uVar2 + 0xc);
  pcVar3 = (char *)(ulong)*(uint *)((long)ud + 8);
  if (*(int *)((long)ud + 4) - *(uint *)((long)ud + 8) < v + 10) {
    pcVar3 = lj_buf_need2((SBuf *)ud,v + 10);
  }
  pcVar3[0] = '\x1b';
  pcVar3[1] = 'L';
  pcVar3[2] = 'J';
  pcVar3[3] = '\x02';
  pcVar3[4] = *(byte *)(*(long *)((long)ud + 0x10) + 0x25) & 4 |
              (*(int *)((long)ud + 0x28) != 0) * '\x02';
  pcVar3 = pcVar3 + 5;
  if (*(int *)((long)ud + 0x28) == 0) {
    pcVar3 = lj_strfmt_wuleb128(pcVar3,v);
    memcpy(pcVar3,(void *)(uVar2 + 0x10),(ulong)v);
    pcVar3 = pcVar3 + v;
  }
  uVar1 = (**(code **)((long)ud + 0x18))
                    (*(undefined4 *)((long)ud + 0xc),*(int *)((long)ud + 8),
                     (int)pcVar3 - *(int *)((long)ud + 8),*(undefined8 *)((long)ud + 0x20));
  *(undefined4 *)((long)ud + 0x2c) = uVar1;
  bcwrite_proto((BCWriteCtx *)ud,*(GCproto **)((long)ud + 0x10));
  if (*(int *)((long)ud + 0x2c) == 0) {
    uStack_28 = uStack_28 & 0xffffffffffffff;
    uVar1 = (**(code **)((long)ud + 0x18))
                      (*(undefined4 *)((long)ud + 0xc),(long)&uStack_28 + 7,1,
                       *(undefined8 *)((long)ud + 0x20));
    *(undefined4 *)((long)ud + 0x2c) = uVar1;
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cpwriter(lua_State *L, lua_CFunction dummy, void *ud)
{
  BCWriteCtx *ctx = (BCWriteCtx *)ud;
  UNUSED(L); UNUSED(dummy);
  lj_buf_need(&ctx->sb, 1024);  /* Avoids resize for most prototypes. */
  bcwrite_header(ctx);
  bcwrite_proto(ctx, ctx->pt);
  bcwrite_footer(ctx);
  return NULL;
}